

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcCaptureOpenDevice(void)

{
  uint32 frequency_00;
  ALCenum format_00;
  ALsizei buffersize_00;
  char *devicename_00;
  ALCdevice *retval_00;
  ALCchar *local_288;
  ALCchar *local_280;
  ALint local_278;
  ALint local_274;
  ALCchar *extensions;
  ALCchar *devspec;
  ALint minor_version;
  ALint major_version;
  ALCdevice *retval;
  ALCsizei buffersize;
  ALCenum format;
  ALCuint frequency;
  ALCchar *devicename;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&devicename);
  if (io_failure == 0) {
    devicename_00 = IO_STRING();
    frequency_00 = IO_UINT32();
    format_00 = IO_ALCENUM();
    buffersize_00 = IO_ALSIZEI();
    retval_00 = (ALCdevice *)IO_PTR();
    if (retval_00 == (ALCdevice *)0x0) {
      local_274 = 0;
      local_278 = 0;
      local_280 = (ALCchar *)0x0;
      local_288 = (ALCchar *)0x0;
    }
    else {
      local_274 = IO_INT32();
      local_278 = IO_INT32();
      local_280 = IO_STRING();
      local_288 = IO_STRING();
    }
    if (io_failure == 0) {
      visit_alcCaptureOpenDevice
                ((CallerInfo *)&devicename,retval_00,devicename_00,frequency_00,format_00,
                 buffersize_00,local_274,local_278,local_280,local_288);
    }
  }
  return;
}

Assistant:

static void decode_alcCaptureOpenDevice(void)
{
    IO_START(alcCaptureOpenDevice);
    const ALCchar *devicename = (const ALCchar *) IO_STRING();
    const ALCuint frequency = IO_UINT32();
    const ALCenum format = IO_ALCENUM();
    const ALCsizei buffersize = IO_ALSIZEI();
    ALCdevice *retval = (ALCdevice *) IO_PTR();
    const ALint major_version = retval ? IO_INT32() : 0;
    const ALint minor_version = retval ? IO_INT32() : 0;
    const ALCchar *devspec = (const ALCchar *) (retval ? IO_STRING() : NULL);
    const ALCchar *extensions = (const ALCchar *) (retval ? IO_STRING() : NULL);
    if (!io_failure) visit_alcCaptureOpenDevice(&callerinfo, retval, devicename, frequency, format, buffersize, major_version, minor_version, devspec, extensions);
    IO_END();
}